

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove7<(moira::Instr)71,(moira::Mode)7,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined1 local_4c [8];
  Ea<(moira::Mode)7,_1> dst;
  Ea<(moira::Mode)7,_1> src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  Op<(moira::Mode)7,1>((Ea<(moira::Mode)7,_1> *)&dst.ext2,this,op & 7,addr);
  Op<(moira::Mode)7,1>((Ea<(moira::Mode)7,_1> *)local_4c,this,(ushort)((int)(uint)op >> 9) & 7,addr)
  ;
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)7,_1> *)&dst.ext2);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)7,_1> *)local_4c);
  return;
}

Assistant:

void
Moira::dasmMove7(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <Mode::AW,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}